

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::updateFT(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  iterator iVar11;
  iterator iVar12;
  HVector *pHVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  double *__args;
  size_t sVar18;
  int iVar19;
  HFactor *pHVar20;
  int *piVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  size_type __new_size;
  double dVar25;
  int local_94;
  HFactor *local_90;
  double local_88;
  double local_80;
  long local_78;
  int local_6c;
  HVector *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  double local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  piVar3 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78 = (long)piVar3[iRow];
  local_50 = (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_78];
  local_80 = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iRow];
  (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[local_78] = -1;
  piVar4 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->FtotalX = this->FtotalX + (piVar4[local_78] - piVar5[local_78]);
  lVar17 = (long)piVar4[local_78];
  if (piVar4[local_78] < piVar5[local_78]) {
    piVar6 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar16 = piVar3[piVar6[lVar17]];
      iVar19 = piVar7[iVar16];
      iVar14 = piVar8[iVar16];
      piVar8[iVar16] = iVar14 + -1;
      iVar16 = iVar19;
      if (iVar19 < iVar14) {
        piVar21 = piVar9 + iVar19;
        do {
          iVar16 = iVar19;
          if (*piVar21 == iRow) break;
          iVar19 = iVar19 + 1;
          piVar21 = piVar21 + 1;
          iVar16 = iVar14;
        } while (iVar14 != iVar19);
      }
      piVar9[iVar16] = piVar9[(long)iVar14 + -1];
      pdVar10[iVar16] = pdVar10[(long)iVar14 + -1];
      lVar17 = lVar17 + 1;
    } while (lVar17 < piVar5[local_78]);
  }
  piVar6 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->FtotalX = this->FtotalX + (piVar6[local_78] - piVar7[local_78]);
  iVar16 = piVar6[local_78];
  lVar17 = (long)iVar16;
  if (iVar16 < piVar7[local_78]) {
    piVar6 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar16 = piVar3[piVar6[lVar17]];
      iVar19 = piVar4[iVar16];
      iVar14 = piVar5[iVar16];
      piVar5[iVar16] = iVar14 + -1;
      iVar23 = iVar19;
      if (iVar19 < iVar14) {
        piVar21 = piVar9 + iVar19;
        do {
          iVar23 = iVar19;
          if (*piVar21 == iRow) break;
          iVar19 = iVar19 + 1;
          piVar21 = piVar21 + 1;
          iVar23 = iVar14;
        } while (iVar14 != iVar19);
      }
      piVar21 = piVar8 + iVar16;
      *piVar21 = *piVar21 + 1;
      piVar9[iVar23] = piVar9[(long)iVar14 + -1];
      pdVar10[iVar23] = pdVar10[(long)iVar14 + -1];
      lVar17 = lVar17 + 1;
    } while (lVar17 < piVar7[local_78]);
  }
  iVar16 = (int)((ulong)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  local_88 = (double)CONCAT44(local_88._4_4_,iVar16);
  iVar11._M_current =
       (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_90 = this;
  local_94 = iRow;
  local_68 = ep;
  if (iVar11._M_current ==
      (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->Ustart,iVar11,(int *)&local_88);
  }
  else {
    *iVar11._M_current = iVar16;
    (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar11._M_current + 1;
  }
  pHVar20 = local_90;
  dVar25 = local_80;
  if (0 < aq->packCount) {
    pvVar1 = &local_90->Uindex;
    pvVar2 = &local_90->Uvalue;
    lVar17 = 0;
    lVar24 = 0;
    lVar22 = 0;
    do {
      piVar3 = (aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = *(int *)((long)piVar3 + lVar24);
      if (iVar16 != local_94) {
        iVar11._M_current =
             (pHVar20->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (pHVar20->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)pvVar1,iVar11,(int *)((long)piVar3 + lVar24)
                    );
          pHVar20 = local_90;
          dVar25 = local_80;
        }
        else {
          *iVar11._M_current = iVar16;
          (pHVar20->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar11._M_current + 1;
        }
        __args = (double *)
                 ((long)(aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar17);
        iVar12._M_current =
             (pHVar20->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (pHVar20->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)pvVar2,iVar12,__args);
          pHVar20 = local_90;
          dVar25 = local_80;
        }
        else {
          *iVar12._M_current = *__args;
          (pHVar20->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
      }
      lVar22 = lVar22 + 1;
      lVar24 = lVar24 + 4;
      lVar17 = lVar17 + 8;
    } while (lVar22 < aq->packCount);
  }
  iVar16 = (int)((ulong)((long)(pHVar20->Uindex).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pHVar20->Uindex).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_88 = (double)CONCAT44(local_88._4_4_,iVar16);
  iVar11._M_current =
       (pHVar20->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar11._M_current ==
      (pHVar20->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&pHVar20->Ulastp,iVar11,(int *)&local_88);
    pHVar20 = local_90;
    dVar25 = local_80;
  }
  else {
    *iVar11._M_current = iVar16;
    (pHVar20->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar11._M_current + 1;
  }
  iVar16 = (pHVar20->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  lVar22 = (long)iVar16;
  iVar19 = (pHVar20->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  iVar14 = (iVar19 - iVar16) + 1;
  pHVar20->UtotalX = pHVar20->UtotalX + iVar14;
  pHVar20->FtotalX = pHVar20->FtotalX + iVar14;
  lVar17 = local_78;
  if (iVar16 < iVar19) {
    local_58 = &pHVar20->URindex;
    local_60 = &pHVar20->URvalue;
    iVar19 = iVar19 - iVar16;
    do {
      iVar16 = (pHVar20->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(pHVar20->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar22]];
      if ((pHVar20->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar16] == 0) {
        local_6c = (pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar16];
        local_40 = (long)local_6c;
        iVar14 = (pHVar20->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar16];
        local_6c = iVar14 - local_6c;
        uVar15 = (uint)((double)local_6c * 1.1 + 5.0);
        local_38 = (ulong)uVar15;
        iVar23 = (int)((ulong)((long)(pHVar20->URindex).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pHVar20->URindex).super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2);
        __new_size = (size_type)(int)(uVar15 + iVar23);
        std::vector<int,_std::allocator<int>_>::resize(local_58,__new_size);
        std::vector<double,_std::allocator<double>_>::resize(local_60,__new_size);
        lVar17 = local_40;
        lVar24 = (long)iVar23;
        sVar18 = (long)iVar14 * 4 + local_40 * -4;
        if (sVar18 != 0) {
          piVar3 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_48 = lVar24;
          memmove(piVar3 + lVar24,piVar3 + local_40,sVar18);
          lVar24 = local_48;
        }
        sVar18 = (long)iVar14 * 8 + lVar17 * -8;
        if (sVar18 != 0) {
          pdVar10 = (local_60->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          memmove(pdVar10 + lVar24,pdVar10 + lVar17,sVar18);
        }
        (local_90->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar16] = iVar23;
        (local_90->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar16] = iVar23 + local_6c;
        (local_90->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar16] = (int)local_38 - local_6c;
        pHVar20 = local_90;
        lVar17 = local_78;
        dVar25 = local_80;
      }
      piVar21 = (pHVar20->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + iVar16;
      *piVar21 = *piVar21 + -1;
      piVar3 = (pHVar20->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar14 = piVar3[iVar16];
      piVar3[iVar16] = iVar14 + 1;
      (pHVar20->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar14] = local_94;
      (pHVar20->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar14] =
           (pHVar20->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar22];
      lVar22 = lVar22 + 1;
      iVar19 = iVar19 + -1;
    } while (iVar19 != 0);
  }
  piVar21 = (pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + lVar17;
  iVar11._M_current =
       (pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar11._M_current ==
      (pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pHVar20->URstart,iVar11,piVar21);
    pHVar20 = local_90;
    dVar25 = local_80;
  }
  else {
    *iVar11._M_current = *piVar21;
    (pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar11._M_current + 1;
  }
  pHVar13 = local_68;
  piVar21 = (pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + lVar17;
  iVar11._M_current =
       (pHVar20->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar11._M_current ==
      (pHVar20->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pHVar20->URlastp,iVar11,piVar21);
    pHVar20 = local_90;
    dVar25 = local_80;
  }
  else {
    *iVar11._M_current = *piVar21;
    (pHVar20->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar11._M_current + 1;
  }
  iVar16 = ((pHVar20->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] +
           (pHVar20->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar17]) -
           (pHVar20->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar17];
  local_88 = (double)CONCAT44(local_88._4_4_,iVar16);
  iVar11._M_current =
       (pHVar20->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar11._M_current ==
      (pHVar20->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&pHVar20->URspace,iVar11,(int *)&local_88);
    pHVar20 = local_90;
    dVar25 = local_80;
  }
  else {
    *iVar11._M_current = iVar16;
    (pHVar20->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar11._M_current + 1;
  }
  iVar11._M_current =
       (pHVar20->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pHVar20->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[local_94] =
       (int)((ulong)((long)iVar11._M_current -
                    (long)(pHVar20->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (iVar11._M_current ==
      (pHVar20->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pHVar20->UpivotIndex,iVar11,&local_94);
    pHVar20 = local_90;
    dVar25 = local_80;
  }
  else {
    *iVar11._M_current = local_94;
    (pHVar20->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar11._M_current + 1;
  }
  local_88 = dVar25 * local_50;
  iVar12._M_current =
       (pHVar20->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar12._M_current ==
      (pHVar20->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pHVar20->UpivotValue,iVar12,&local_88);
    pHVar20 = local_90;
  }
  else {
    *iVar12._M_current = local_88;
    (pHVar20->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  if (0 < pHVar13->packCount) {
    pvVar1 = &pHVar20->PFindex;
    pvVar2 = &pHVar20->PFvalue;
    lVar17 = 0;
    lVar22 = 0;
    do {
      piVar3 = (pHVar13->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = *(int *)((long)piVar3 + lVar17);
      if (iVar16 != local_94) {
        iVar11._M_current =
             (pHVar20->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (pHVar20->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)pvVar1,iVar11,(int *)((long)piVar3 + lVar17)
                    );
          pHVar20 = local_90;
        }
        else {
          *iVar11._M_current = iVar16;
          (pHVar20->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar11._M_current + 1;
        }
        local_88 = -*(double *)
                     ((long)(pHVar13->packValue).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar17 * 2) * local_50;
        iVar12._M_current =
             (pHVar20->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (pHVar20->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (pvVar2,iVar12,&local_88);
          pHVar20 = local_90;
        }
        else {
          *iVar12._M_current = local_88;
          (pHVar20->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
      }
      lVar22 = lVar22 + 1;
      lVar17 = lVar17 + 4;
    } while (lVar22 < pHVar13->packCount);
  }
  piVar3 = (pHVar20->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar16 = (int)((ulong)((long)(pHVar20->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pHVar20->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  pHVar20->UtotalX = (pHVar20->UtotalX - piVar3[-1]) + iVar16;
  pHVar20->FtotalX = (iVar16 - piVar3[-1]) + pHVar20->FtotalX + 1;
  iVar11._M_current =
       (pHVar20->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar11._M_current ==
      (pHVar20->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pHVar20->PFpivotIndex,iVar11,&local_94);
    pHVar20 = local_90;
  }
  else {
    *iVar11._M_current = local_94;
    (pHVar20->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar11._M_current + 1;
  }
  lVar17 = local_78;
  iVar16 = (int)((ulong)((long)(pHVar20->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pHVar20->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_88 = (double)CONCAT44(local_88._4_4_,iVar16);
  iVar11._M_current =
       (pHVar20->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar11._M_current ==
      (pHVar20->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&pHVar20->PFstart,iVar11,(int *)&local_88);
  }
  else {
    *iVar11._M_current = iVar16;
    (pHVar20->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar11._M_current + 1;
    local_90 = pHVar20;
  }
  iVar16 = ((local_90->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] -
           (local_90->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar17]) + local_90->UtotalX;
  local_90->UtotalX = iVar16;
  local_90->UtotalX =
       (iVar16 - (local_90->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar17]) +
       (local_90->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar17];
  return;
}

Assistant:

void HFactor::updateFT(HVector *aq, HVector *ep, int iRow, int *hint) {
    // Store pivot
    int pLogic = UpivotLookup[iRow];
    double pivot = UpivotValue[pLogic];
    double alpha = aq->array[iRow];
    UpivotIndex[pLogic] = -1;

    // Delete pivotal row from U
    FtotalX -= URlastp[pLogic] - URstart[pLogic];
    for (int k = URstart[pLogic]; k < URlastp[pLogic]; k++) {
        // Find the pivotal position
        int iLogic = UpivotLookup[URindex[k]];
        int iFind = Ustart[iLogic];
        int iLast = --Ulastp[iLogic];
        for (; iFind <= iLast; iFind++)
            if (Uindex[iFind] == iRow)
                break;
        // Put last to find, and delete last
        Uindex[iFind] = Uindex[iLast];
        Uvalue[iFind] = Uvalue[iLast];
    }

    // Delete pivotal column from UR
    FtotalX -= Ulastp[pLogic] - Ustart[pLogic];
    for (int k = Ustart[pLogic]; k < Ulastp[pLogic]; k++) {
        // Find the pivotal position
        int iLogic = UpivotLookup[Uindex[k]];
        int iFind = URstart[iLogic];
        int iLast = --URlastp[iLogic];
        for (; iFind <= iLast; iFind++)
            if (URindex[iFind] == iRow)
                break;
        // Put last to find, and delete last
        URspace[iLogic]++;
        URindex[iFind] = URindex[iLast];
        URvalue[iFind] = URvalue[iLast];
    }

    // Store column to U
    Ustart.push_back(Uindex.size());
    for (int i = 0; i < aq->packCount; i++)
        if (aq->packIndex[i] != iRow) {
            Uindex.push_back(aq->packIndex[i]);
            Uvalue.push_back(aq->packValue[i]);
        }
    Ulastp.push_back(Uindex.size());
    int UstartX = Ustart.back();
    int UendX = Ulastp.back();
    UtotalX += UendX - UstartX + 1;
    FtotalX += UendX - UstartX + 1;

    // Store column as UR elements
    for (int k = UstartX; k < UendX; k++) {
        // Which ETA file
        int iLogic = UpivotLookup[Uindex[k]];

        // Move row to the end if necessary
        if (URspace[iLogic] == 0) {
            // Make pointers
            int row_start = URstart[iLogic];
            int row_count = URlastp[iLogic] - row_start;
            int new_start = URindex.size();
            int new_space = row_count * 1.1 + 5;

            // Check matrix UR
            URindex.resize(new_start + new_space);
            URvalue.resize(new_start + new_space);

            // Move elements
            int iFrom = row_start;
            int iEnd = row_start + row_count;
            int iTo = new_start;
            copy(&URindex[iFrom], &URindex[iEnd], &URindex[iTo]);
            copy(&URvalue[iFrom], &URvalue[iEnd], &URvalue[iTo]);

            // Save new pointers
            URstart[iLogic] = new_start;
            URlastp[iLogic] = new_start + row_count;
            URspace[iLogic] = new_space - row_count;
        }

        // Put into the next available space
        URspace[iLogic]--;
        int iPut = URlastp[iLogic]++;
        URindex[iPut] = iRow;
        URvalue[iPut] = Uvalue[k];
    }

    // Store UR pointers
    URstart.push_back(URstart[pLogic]);
    URlastp.push_back(URstart[pLogic]);
    URspace.push_back(URspace[pLogic] + URlastp[pLogic] - URstart[pLogic]);

    // Update pivot count
    UpivotLookup[iRow] = UpivotIndex.size();
    UpivotIndex.push_back(iRow);
    UpivotValue.push_back(pivot * alpha);

    // Store row_ep as R matrix
    for (int i = 0; i < ep->packCount; i++) {
        if (ep->packIndex[i] != iRow) {
            PFindex.push_back(ep->packIndex[i]);
            PFvalue.push_back(-ep->packValue[i] * pivot);
        }
    }
    UtotalX += PFindex.size() - PFstart.back();
    FtotalX += PFindex.size() - PFstart.back() + 1;

    // Store R matrix pivot
    PFpivotIndex.push_back(iRow);
    PFstart.push_back(PFindex.size());

    // Update total countX
    UtotalX -= Ulastp[pLogic] - Ustart[pLogic];
    UtotalX -= URlastp[pLogic] - URstart[pLogic];

//    // See if we want refactor
//    if (UtotalX > UmeritX && PFpivotIndex.size() > 100)
//        *hint = 1;
}